

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>,_bool>
* __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
::insert_unique<std::piecewise_construct_t_const&,std::tuple<S2Shape*const&>,std::tuple<>>
          (pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>,_bool>
           *__return_storage_ptr__,
          btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
          *this,key_type *key,piecewise_construct_t *args,tuple<S2Shape_*const_&> *args_1,
          tuple<> *args_2)

{
  bool bVar1;
  node_type **ppnVar2;
  node_type *pnVar3;
  key_type *y;
  undefined8 extraout_RDX;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
  bVar4;
  iterator iVar5;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
  iter_00;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
  iter_01;
  bool local_119;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *local_118;
  int local_110;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
  local_f0;
  bool local_d9;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *local_d8;
  int local_d0;
  undefined1 local_b0 [8];
  iterator last;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
  local_70;
  undefined1 (*local_60) [12];
  iterator *iter;
  undefined4 local_50;
  undefined1 auStack_48 [8];
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>,_int>
  res;
  tuple<> *args_local_2;
  tuple<S2Shape_*const_&> *args_local_1;
  piecewise_construct_t *args_local;
  key_type *key_local;
  btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *this_local;
  
  res._16_8_ = args_2;
  bVar1 = btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
          ::empty((btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                   *)this);
  if (bVar1) {
    pnVar3 = btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
             ::new_leaf_root_node
                       ((btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                         *)this,1);
    *(node_type **)(this + 8) = pnVar3;
    ppnVar2 = btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
              ::mutable_root((btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                              *)this);
    *ppnVar2 = pnVar3;
  }
  pnVar3 = btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
           ::root((btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                   *)this);
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
  ::btree_iterator((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
                    *)&iter,pnVar3,0);
  bVar4._12_4_ = 0;
  bVar4.node = (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                *)iter;
  bVar4.position = local_50;
  internal_locate<S2Shape*,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>&,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>*>>
            ((pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>,_int>
              *)auStack_48,this,key,bVar4);
  local_60 = (undefined1 (*) [12])auStack_48;
  if (res.first.position == 0x40000000) {
    iter_00.node = (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                    *)((ulong)res.first.node & 0xffffffff);
    iter_00._8_8_ = extraout_RDX;
    bVar4 = internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>&,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>*>>
                      ((btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
                        *)auStack_48,iter_00);
    local_70.node = bVar4.node;
    local_70.position = bVar4.position;
    last._15_1_ = 0;
    std::
    make_pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>&,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>*>,bool>
              (__return_storage_ptr__,&local_70,(bool *)&last.field_0xf);
  }
  else {
    if (res.first.position == 0) {
      iter_01.node = (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                      *)((ulong)res.first.node & 0xffffffff);
      iter_01._8_8_ = extraout_RDX;
      bVar4 = internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>&,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>*>>
                        ((btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
                          *)auStack_48,iter_01);
      local_d8 = bVar4.node;
      local_d0 = bVar4.position;
      local_b0 = (undefined1  [8])local_d8;
      last.node._0_4_ = local_d0;
      if (local_d8 !=
          (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
           *)0x0) {
        y = btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
            ::key((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
                   *)local_b0);
        bVar1 = compare_keys<S2Shape*,S2Shape*>(this,key,y);
        if (!bVar1) {
          local_d9 = false;
          std::
          make_pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>&,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>*>&,bool>
                    (__return_storage_ptr__,
                     (btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
                      *)local_b0,&local_d9);
          return __return_storage_ptr__;
        }
      }
    }
    local_108 = *(undefined8 *)*local_60;
    uStack_100 = (undefined4)*(undefined8 *)(*local_60 + 8);
    uStack_fc = (undefined4)((ulong)*(undefined8 *)(*local_60 + 8) >> 0x20);
    iVar5._12_4_ = 0;
    iVar5._0_12_ = *local_60;
    iVar5 = internal_emplace<std::piecewise_construct_t_const&,std::tuple<S2Shape*const&>,std::tuple<>>
                      (this,iVar5,args,args_1,(tuple<> *)res._16_8_);
    local_118 = iVar5.node;
    local_110 = iVar5.position;
    local_119 = true;
    local_f0.node = local_118;
    local_f0.position = local_110;
    std::
    make_pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>&,std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>*>,bool>
              (__return_storage_ptr__,&local_f0,&local_119);
  }
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::insert_unique(const key_type &key, Args &&... args)
    -> std::pair<iterator, bool> {
  if (empty()) {
    mutable_root() = rightmost_ = new_leaf_root_node(1);
  }

  std::pair<iterator, int> res = internal_locate(key, iterator(root(), 0));
  iterator &iter = res.first;
  if (res.second == kExactMatch) {
    // The key already exists in the tree, do nothing.
    return std::make_pair(internal_last(iter), false);
  } else if (!res.second) {
    iterator last = internal_last(iter);
    if (last.node && !compare_keys(key, last.key())) {
      // The key already exists in the tree, do nothing.
      return std::make_pair(last, false);
    }
  }

  return std::make_pair(internal_emplace(iter, std::forward<Args>(args)...),
                        true);
}